

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmaxheap.c
# Opt level: O2

zmaxheap_t * zmaxheap_create(size_t el_sz)

{
  zmaxheap_t *pzVar1;
  code *pcVar2;
  
  pzVar1 = (zmaxheap_t *)calloc(1,0x28);
  pzVar1->el_sz = el_sz;
  pcVar2 = swap_default;
  if (el_sz == 8) {
    pcVar2 = swap_pointer;
  }
  pzVar1->swap = pcVar2;
  return pzVar1;
}

Assistant:

zmaxheap_t *zmaxheap_create(size_t el_sz)
{
    zmaxheap_t *heap = calloc(1, sizeof(zmaxheap_t));
    heap->el_sz = el_sz;

    heap->swap = swap_default;

    if (el_sz == sizeof(void*))
        heap->swap = swap_pointer;

    return heap;
}